

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

json_t * json_copy(json_t *json)

{
  undefined8 uVar1;
  ulong uVar2;
  json_t *pjVar3;
  char *__s;
  json_t *pjVar4;
  size_t key_len;
  void *pvVar5;
  ulong uVar6;
  
  if (json != (json_t *)0x0) {
    switch(json->type) {
    case JSON_OBJECT:
      pjVar3 = json_object();
      if (pjVar3 != (json_t *)0x0) {
        if (json->type == JSON_OBJECT) {
          pvVar5 = hashtable_iter((hashtable_t *)(json + 2));
        }
        else {
          pvVar5 = (void *)0x0;
        }
        if (pvVar5 == (void *)0x0) {
          __s = (char *)0x0;
        }
        else {
          __s = (char *)hashtable_iter_key(pvVar5);
        }
        if (__s == (char *)0x0) {
          return pjVar3;
        }
        do {
          pjVar4 = (json_t *)hashtable_iter_value(__s + -0x28);
          if (pjVar4 == (json_t *)0x0) {
            return pjVar3;
          }
          key_len = strlen(__s);
          json_object_setn_new_nocheck(pjVar3,__s,key_len,pjVar4);
          if (json->type == JSON_OBJECT) {
            pvVar5 = hashtable_iter_next((hashtable_t *)(json + 2),__s + -0x28);
          }
          else {
            pvVar5 = (void *)0x0;
          }
          if (pvVar5 == (void *)0x0) {
            __s = (char *)0x0;
          }
          else {
            __s = (char *)hashtable_iter_key(pvVar5);
          }
        } while (__s != (char *)0x0);
        return pjVar3;
      }
      break;
    case JSON_ARRAY:
      pjVar3 = json_array();
      if (pjVar3 != (json_t *)0x0) {
        uVar6 = 0;
        while( true ) {
          if (json->type == JSON_ARRAY) {
            uVar2 = *(ulong *)(json + 4);
          }
          else {
            uVar2 = 0;
          }
          if (uVar2 <= uVar6) break;
          if ((json->type == JSON_ARRAY) && (uVar6 < *(ulong *)(json + 4))) {
            pjVar4 = *(json_t **)(*(long *)(json + 6) + uVar6 * 8);
          }
          else {
            pjVar4 = (json_t *)0x0;
          }
          json_array_append_new(pjVar3,pjVar4);
          uVar6 = uVar6 + 1;
        }
        return pjVar3;
      }
      break;
    case JSON_STRING:
      pjVar3 = string_create(*(char **)(json + 2),*(size_t *)(json + 4),0);
      return pjVar3;
    case JSON_INTEGER:
      uVar1 = *(undefined8 *)(json + 2);
      pjVar3 = (json_t *)jsonp_malloc(0x10);
      if (pjVar3 != (json_t *)0x0) {
        pjVar3->type = JSON_INTEGER;
        *(undefined8 *)(pjVar3 + 2) = uVar1;
        return pjVar3;
      }
      break;
    case JSON_REAL:
      pjVar3 = json_real_copy(json);
      return pjVar3;
    case JSON_TRUE:
    case JSON_FALSE:
    case JSON_NULL:
      goto switchD_00114f70_caseD_5;
    }
  }
  json = (json_t *)0x0;
switchD_00114f70_caseD_5:
  return json;
}

Assistant:

json_t *json_copy(json_t *json) {
    if (!json)
        return NULL;

    switch (json_typeof(json)) {
        case JSON_OBJECT:
            return json_object_copy(json);
        case JSON_ARRAY:
            return json_array_copy(json);
        case JSON_STRING:
            return json_string_copy(json);
        case JSON_INTEGER:
            return json_integer_copy(json);
        case JSON_REAL:
            return json_real_copy(json);
        case JSON_TRUE:
        case JSON_FALSE:
        case JSON_NULL:
            return json;
        default:
            return NULL;
    }
}